

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O1

void __thiscall CircBufTest::test6(CircBufTest *this)

{
  CircularBuffer t2Buf;
  CircularBuffer t1Buf;
  anon_struct_129_2_522d0828 buf_t2;
  anon_struct_255_2_a6799241 buf_t1;
  CircularBuffer aCStack_358 [224];
  CircularBuffer local_278 [224];
  uchar local_198 [383];
  char local_19;
  
  memset(local_198 + 0x81,0xff,0xfe);
  local_198[0] = 0xff;
  local_198[1] = 0xff;
  local_198[2] = 0xff;
  local_198[3] = 0xff;
  local_198[4] = 0xff;
  local_198[5] = 0xff;
  local_198[6] = 0xff;
  local_198[7] = 0xff;
  local_198[8] = 0xff;
  local_198[9] = 0xff;
  local_198[10] = 0xff;
  local_198[0xb] = 0xff;
  local_198[0xc] = 0xff;
  local_198[0xd] = 0xff;
  local_198[0xe] = 0xff;
  local_198[0xf] = 0xff;
  local_198[0x10] = 0xff;
  local_198[0x11] = 0xff;
  local_198[0x12] = 0xff;
  local_198[0x13] = 0xff;
  local_198[0x14] = 0xff;
  local_198[0x15] = 0xff;
  local_198[0x16] = 0xff;
  local_198[0x17] = 0xff;
  local_198[0x18] = 0xff;
  local_198[0x19] = 0xff;
  local_198[0x1a] = 0xff;
  local_198[0x1b] = 0xff;
  local_198[0x1c] = 0xff;
  local_198[0x1d] = 0xff;
  local_198[0x1e] = 0xff;
  local_198[0x1f] = 0xff;
  local_198[0x20] = 0xff;
  local_198[0x21] = 0xff;
  local_198[0x22] = 0xff;
  local_198[0x23] = 0xff;
  local_198[0x24] = 0xff;
  local_198[0x25] = 0xff;
  local_198[0x26] = 0xff;
  local_198[0x27] = 0xff;
  local_198[0x28] = 0xff;
  local_198[0x29] = 0xff;
  local_198[0x2a] = 0xff;
  local_198[0x2b] = 0xff;
  local_198[0x2c] = 0xff;
  local_198[0x2d] = 0xff;
  local_198[0x2e] = 0xff;
  local_198[0x2f] = 0xff;
  local_198[0x30] = 0xff;
  local_198[0x31] = 0xff;
  local_198[0x32] = 0xff;
  local_198[0x33] = 0xff;
  local_198[0x34] = 0xff;
  local_198[0x35] = 0xff;
  local_198[0x36] = 0xff;
  local_198[0x37] = 0xff;
  local_198[0x38] = 0xff;
  local_198[0x39] = 0xff;
  local_198[0x3a] = 0xff;
  local_198[0x3b] = 0xff;
  local_198[0x3c] = 0xff;
  local_198[0x3d] = 0xff;
  local_198[0x3e] = 0xff;
  local_198[0x3f] = 0xff;
  local_198[0x40] = 0xff;
  local_198[0x41] = 0xff;
  local_198[0x42] = 0xff;
  local_198[0x43] = 0xff;
  local_198[0x44] = 0xff;
  local_198[0x45] = 0xff;
  local_198[0x46] = 0xff;
  local_198[0x47] = 0xff;
  local_198[0x48] = 0xff;
  local_198[0x49] = 0xff;
  local_198[0x4a] = 0xff;
  local_198[0x4b] = 0xff;
  local_198[0x4c] = 0xff;
  local_198[0x4d] = 0xff;
  local_198[0x4e] = 0xff;
  local_198[0x4f] = 0xff;
  local_198[0x50] = 0xff;
  local_198[0x51] = 0xff;
  local_198[0x52] = 0xff;
  local_198[0x53] = 0xff;
  local_198[0x54] = 0xff;
  local_198[0x55] = 0xff;
  local_198[0x56] = 0xff;
  local_198[0x57] = 0xff;
  local_198[0x58] = 0xff;
  local_198[0x59] = 0xff;
  local_198[0x5a] = 0xff;
  local_198[0x5b] = 0xff;
  local_198[0x5c] = 0xff;
  local_198[0x5d] = 0xff;
  local_198[0x5e] = 0xff;
  local_198[0x5f] = 0xff;
  local_198[0x60] = 0xff;
  local_198[0x61] = 0xff;
  local_198[0x62] = 0xff;
  local_198[99] = 0xff;
  local_198[100] = 0xff;
  local_198[0x65] = 0xff;
  local_198[0x66] = 0xff;
  local_198[0x67] = 0xff;
  local_198[0x68] = 0xff;
  local_198[0x69] = 0xff;
  local_198[0x6a] = 0xff;
  local_198[0x6b] = 0xff;
  local_198[0x6c] = 0xff;
  local_198[0x6d] = 0xff;
  local_198[0x6e] = 0xff;
  local_198[0x6f] = 0xff;
  local_198[0x70] = 0xff;
  local_198[0x71] = 0xff;
  local_198[0x72] = 0xff;
  local_198[0x73] = 0xff;
  local_198[0x74] = 0xff;
  local_198[0x75] = 0xff;
  local_198[0x76] = 0xff;
  local_198[0x77] = 0xff;
  local_198[0x78] = 0xff;
  local_198[0x79] = 0xff;
  local_198[0x7a] = 0xff;
  local_198[0x7b] = 0xff;
  local_198[0x7c] = 0xff;
  local_198[0x7d] = 0xff;
  local_198[0x7e] = 0xff;
  local_198[0x7f] = 0xff;
  local_19 = -1;
  local_198[0x80] = -1;
  JetHead::CircularBuffer::CircularBuffer(local_278,local_198 + 0x81,0xfe);
  JetHead::CircularBuffer::CircularBuffer(aCStack_358,local_198,0x80);
  test1(this,local_278);
  if (local_19 != -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x388,"Wrapped circular buffer has one past the end problem");
  }
  test2(this,aCStack_358);
  if (local_198[0x80] != -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x38f,"Wrapped circular buffer has one past the end problem");
  }
  JetHead::CircularBuffer::~CircularBuffer(aCStack_358);
  JetHead::CircularBuffer::~CircularBuffer(local_278);
  return;
}

Assistant:

void CircBufTest::test6()
{

	// Use a struct so that you can set a watchpoint in gdb on overflow
	// to see when circbuf attempts to use a byte of memeory it wasn't
	// given.
	struct {
		uint8_t testBuf[HUGE_BUF_SIZE];
		uint8_t overflow;
	} buf_t1;
	
	struct {
		uint8_t testBuf[BUFFER_SIZE];
		uint8_t overflow;
	} buf_t2 ;

	fill(buf_t1.testBuf, buf_t1.testBuf + HUGE_BUF_SIZE, -1);
	fill(buf_t2.testBuf, buf_t2.testBuf + BUFFER_SIZE, -1);
	
	buf_t1.overflow = (uint8_t)-1;
	buf_t2.overflow = (uint8_t)-1;
	
	CircularBuffer t1Buf(buf_t1.testBuf, HUGE_BUF_SIZE);
	CircularBuffer t2Buf(buf_t2.testBuf, BUFFER_SIZE);
	
	// Try test 1 again and check overflow
	test1(&t1Buf);
	if (buf_t1.overflow != (uint8_t)-1)
	{
		TestFailed("Wrapped circular buffer has one past the end problem");
	}
	
	test2(&t2Buf);

	if( buf_t2.overflow != (uint8_t)-1)
	{
		TestFailed("Wrapped circular buffer has one past the end problem");
	}
}